

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O1

void aom_paeth_predictor_16x16_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  int iVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 in_ZMM6 [64];
  
  bVar1 = above[-1];
  auVar12[1] = 0;
  auVar12[0] = bVar1;
  auVar12[2] = bVar1;
  auVar12[3] = 0;
  auVar12[4] = bVar1;
  auVar12[5] = 0;
  auVar12[6] = bVar1;
  auVar12[7] = 0;
  auVar12[8] = bVar1;
  auVar12[9] = 0;
  auVar12[10] = bVar1;
  auVar12[0xb] = 0;
  auVar12[0xc] = bVar1;
  auVar12[0xd] = 0;
  auVar12[0xe] = bVar1;
  auVar12[0xf] = 0;
  auVar12[0x10] = bVar1;
  auVar12[0x11] = 0;
  auVar12[0x12] = bVar1;
  auVar12[0x13] = 0;
  auVar12[0x14] = bVar1;
  auVar12[0x15] = 0;
  auVar12[0x16] = bVar1;
  auVar12[0x17] = 0;
  auVar12[0x18] = bVar1;
  auVar12[0x19] = 0;
  auVar12[0x1a] = bVar1;
  auVar12[0x1b] = 0;
  auVar12[0x1c] = bVar1;
  auVar12[0x1d] = 0;
  auVar12[0x1e] = bVar1;
  auVar12[0x1f] = 0;
  auVar2 = vpmovzxbw_avx(*(undefined1 (*) [16])above);
  auVar3 = vpunpckhbw_avx(*(undefined1 (*) [16])above,(undefined1  [16])0x0);
  auVar13._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar2;
  auVar13._16_16_ = ZEXT116(1) * auVar3;
  auVar14._16_16_ = *(undefined1 (*) [16])left;
  auVar14._0_16_ = *(undefined1 (*) [16])left;
  auVar9 = vpsubw_avx2(auVar13,auVar12);
  auVar4 = vpabsw_avx2(auVar9);
  auVar15._8_8_ = 0x8000800080008000;
  auVar15._0_8_ = 0x8000800080008000;
  auVar15._16_8_ = 0x8000800080008000;
  auVar15._24_8_ = 0x8000800080008000;
  iVar11 = 0x10;
  auVar6 = vpcmpeqd_avx2(in_ZMM6._0_32_,in_ZMM6._0_32_);
  do {
    auVar8 = vpshufb_avx2(auVar14,auVar15);
    auVar5 = vpaddw_avx2(auVar9,auVar8);
    auVar10 = vpsubw_avx2(auVar5,auVar13);
    auVar10 = vpabsw_avx2(auVar10);
    auVar5 = vpsubw_avx2(auVar5,auVar12);
    auVar5 = vpabsw_avx2(auVar5);
    auVar7 = vpminsw_avx2(auVar10,auVar5);
    auVar7 = vpcmpgtw_avx2(auVar4,auVar7);
    auVar10 = vpcmpgtw_avx2(auVar10,auVar5);
    auVar5 = vpandn_avx2(auVar7,auVar8);
    auVar10 = vpblendvb_avx2(auVar13,auVar12,auVar10);
    auVar10 = vpand_avx2(auVar7,auVar10);
    auVar10 = vpor_avx2(auVar10,auVar5);
    auVar2 = vpackuswb_avx(auVar10._0_16_,auVar10._16_16_);
    *(undefined1 (*) [16])dst = auVar2;
    dst = *(undefined1 (*) [16])dst + stride;
    auVar15 = vpsubw_avx2(auVar15,auVar6);
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
  return;
}

Assistant:

void aom_paeth_predictor_16x16_avx2(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, const uint8_t *left) {
  const __m256i l = get_left_vector(left);
  const __m256i tl16 = _mm256_set1_epi16((int16_t)above[-1]);
  __m256i rep = _mm256_set1_epi16((short)0x8000);
  const __m256i one = _mm256_set1_epi16(1);
  const __m256i top = get_top_vector(above);

  int i;
  for (i = 0; i < 16; ++i) {
    const __m256i l16 = _mm256_shuffle_epi8(l, rep);
    const __m128i row = paeth_16x1_pred(&l16, &top, &tl16);

    _mm_store_si128((__m128i *)dst, row);
    dst += stride;
    rep = _mm256_add_epi16(rep, one);
  }
}